

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles31::Functional::UniformCase::iterate(UniformCase *this)

{
  undefined4 uVar1;
  bool bVar2;
  deUint32 dVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  TestContext *this_00;
  CommandLine *this_01;
  TestLog *log_00;
  UniformCollection *pUVar7;
  Uniform *pUVar8;
  RenderContext *pRVar9;
  MessageBuilder *this_02;
  char *local_660;
  undefined1 local_5c8 [7];
  bool success;
  undefined4 local_448;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  ProgramSources local_3f8;
  undefined1 local_328 [8];
  ShaderProgram dummyProgram;
  undefined1 local_188 [8];
  ShaderProgram program;
  string fragmentSource;
  string vertexSource;
  int i;
  int samplerUnitCounter;
  vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  basicUniformReportsRef;
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  basicUniforms;
  TestLog *log;
  Random rnd;
  UniformCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  pcVar6 = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(pcVar6);
  this_00 = Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getCommandLine(this_00);
  uVar4 = tcu::CommandLine::getBaseSeed(this_01);
  de::Random::Random((Random *)&log,dVar3 ^ uVar4);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  ::vector((vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
            *)&basicUniformReportsRef.
               super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  ::vector((vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
            *)&i);
  vertexSource.field_2._12_4_ = 0;
  vertexSource.field_2._8_4_ = 0;
  while( true ) {
    uVar1 = vertexSource.field_2._8_4_;
    pUVar7 = de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    iVar5 = anon_unknown_1::UniformCollection::getNumUniforms(pUVar7);
    if (iVar5 <= (int)uVar1) break;
    pUVar7 = de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    pUVar8 = anon_unknown_1::UniformCollection::getUniform(pUVar7,vertexSource.field_2._8_4_);
    pUVar7 = de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    anon_unknown_1::UniformCollection::getUniform(pUVar7,vertexSource.field_2._8_4_);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    generateBasicUniforms
              (this,(vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                     *)&basicUniformReportsRef.
                        super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
                *)&i,&pUVar8->type,pcVar6,true,(int *)(vertexSource.field_2._M_local_buf + 0xc),
               (Random *)&log);
    vertexSource.field_2._8_4_ = vertexSource.field_2._8_4_ + 1;
  }
  generateVertexSource_abi_cxx11_
            ((string *)((long)&fragmentSource.field_2 + 8),this,
             (vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
              *)&basicUniformReportsRef.
                 super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  generateFragmentSource_abi_cxx11_
            ((string *)&program.m_program.m_info.linkTimeUs,this,
             (vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
              *)&basicUniformReportsRef.
                 super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pRVar9 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::makeVtxFragSources
            ((ProgramSources *)&dummyProgram.m_program.m_info.linkTimeUs,
             (string *)((long)&fragmentSource.field_2 + 8),
             (string *)&program.m_program.m_info.linkTimeUs);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_188,pRVar9,
             (ProgramSources *)&dummyProgram.m_program.m_info.linkTimeUs);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&dummyProgram.m_program.m_info.linkTimeUs);
  pRVar9 = Context::getRenderContext((this->super_TestCase).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"#version 310 es\nvoid main (void) { gl_Position = vec4(1.0); }\n"
             ,&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,
             "#version 310 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nvoid main (void) { dEQP_FragColor = vec4(0.0, 0.0, 1.0, 1.0); }\n"
             ,&local_441);
  glu::makeVtxFragSources(&local_3f8,&local_418,&local_440);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_328,pRVar9,&local_3f8);
  glu::ProgramSources::~ProgramSources(&local_3f8);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  glu::operator<<(log_00,(ShaderProgram *)local_188);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_188);
  if (bVar2) {
    bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_328);
    if (bVar2) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_5c8,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
      this_02 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_5c8,
                           (char (*) [115])
                           "// Note: calling glUseProgram with a dummy program (will only use the real program once it\'s needed for rendering)"
                          );
      tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_5c8);
      dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_328);
      glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,dVar3);
      uVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                        (this,&basicUniformReportsRef.
                               super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&i,local_188,&log)
      ;
      if ((uVar4 & 1) == 0) {
        local_660 = "Failed";
      }
      else {
        local_660 = "Passed";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)((uVar4 & 1) == 0),local_660);
    }
    else {
      glu::operator<<(log_00,(ShaderProgram *)local_328);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Compilation of dummy program failed");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compile failed");
  }
  local_448 = 1;
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_328);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_188);
  std::__cxx11::string::~string((string *)&program.m_program.m_info.linkTimeUs);
  std::__cxx11::string::~string((string *)(fragmentSource.field_2._M_local_buf + 8));
  std::
  vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  ::~vector((vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
             *)&i);
  std::
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  ::~vector((vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
             *)&basicUniformReportsRef.
                super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)&log);
  return STOP;
}

Assistant:

UniformCase::IterateResult UniformCase::iterate (void)
{
	Random							rnd				(deStringHash(getName()) ^ (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());
	TestLog&						log				= m_testCtx.getLog();
	vector<BasicUniform>			basicUniforms;
	vector<BasicUniformReportRef>	basicUniformReportsRef;

	{
		int samplerUnitCounter = 0;
		for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
			generateBasicUniforms(basicUniforms, basicUniformReportsRef, m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str(), true, samplerUnitCounter, rnd);
	}

	const string					vertexSource	= generateVertexSource(basicUniforms);
	const string					fragmentSource	= generateFragmentSource(basicUniforms);
	const ShaderProgram				program			(m_context.getRenderContext(), glu::makeVtxFragSources(vertexSource, fragmentSource));

	// A dummy program that we'll give to glUseProgram before we actually need
	// the real program above, to see if an implementation tries to use the
	// currently active program for something inappropriate (instead of the
	// program given as argument to, say, glProgramUniform*).
	const ShaderProgram				dummyProgram	(m_context.getRenderContext(), glu::makeVtxFragSources("#version 310 es\n"
																										   "void main (void) { gl_Position = vec4(1.0); }\n",

																										   "#version 310 es\n"
																										   "layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
																										   "void main (void) { dEQP_FragColor = vec4(0.0, 0.0, 1.0, 1.0); }\n"));

	log << program;

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	if (!dummyProgram.isOk())
	{
		log << dummyProgram;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation of dummy program failed");
		return STOP;
	}

	log << TestLog::Message << "// Note: calling glUseProgram with a dummy program (will only use the real program once it's needed for rendering)" << TestLog::EndMessage;
	glUseProgram(dummyProgram.getProgram());

	const bool success = test(basicUniforms, basicUniformReportsRef, program, rnd);
	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							success ? "Passed"				: "Failed");

	return STOP;
}